

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

string * __thiscall
viface::VIfaceImpl::ioctlGetIPv4_abi_cxx11_
          (string *__return_storage_ptr__,VIfaceImpl *this,unsigned_long request)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  int *piVar5;
  runtime_error *prVar6;
  allocator aaStack_218 [32];
  char addr [16];
  string local_1e8;
  ifreq ifr;
  ostringstream what;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&what);
  iVar2 = this->kernel_socket;
  psVar1 = &this->name;
  std::__cxx11::string::string((string *)&local_1e8,(string *)psVar1);
  read_flags(iVar2,&local_1e8,&ifr);
  std::__cxx11::string::~string((string *)&local_1e8);
  iVar2 = ioctl(this->kernel_socket,request,&ifr);
  if (iVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&what,"--- Unable to get IPv4 for ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,".");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&what,"    Error: ");
    piVar5 = __errno_location();
    pcVar3 = strerror(*piVar5);
    std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<((ostream *)&what," (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
    poVar4 = std::operator<<(poVar4,").");
    std::endl<char,std::char_traits<char>>(poVar4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)aaStack_218);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  addr[0] = '\0';
  addr[1] = '\0';
  addr[2] = '\0';
  addr[3] = '\0';
  addr[4] = '\0';
  addr[5] = '\0';
  addr[6] = '\0';
  addr[7] = '\0';
  addr[8] = '\0';
  addr[9] = '\0';
  addr[10] = '\0';
  addr[0xb] = '\0';
  addr[0xc] = '\0';
  addr[0xd] = '\0';
  addr[0xe] = '\0';
  addr[0xf] = '\0';
  pcVar3 = inet_ntop(2,(void *)((long)&ifr.ifr_ifru + 4),addr,0x10);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,addr,aaStack_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&what);
    return __return_storage_ptr__;
  }
  poVar4 = std::operator<<((ostream *)&what,"--- Unable to convert IPv4 for ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,".");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&what,"    Error: ");
  piVar5 = __errno_location();
  pcVar3 = strerror(*piVar5);
  std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<((ostream *)&what," (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
  poVar4 = std::operator<<(poVar4,").");
  std::endl<char,std::char_traits<char>>(poVar4);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)aaStack_218);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string VIfaceImpl::ioctlGetIPv4(unsigned long request) const
{
    ostringstream what;

    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    if (ioctl(this->kernel_socket, request, &ifr) != 0) {
        what << "--- Unable to get IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Convert binary IP address to string
    char addr[INET_ADDRSTRLEN];
    memset(&addr, 0, sizeof(addr));

    struct sockaddr_in* ipaddr = (struct sockaddr_in*) &ifr.ifr_addr;
    if (inet_ntop(AF_INET, &(ipaddr->sin_addr), addr, sizeof(addr)) == NULL) {
        what << "--- Unable to convert IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return string(addr);
}